

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image * rf_image_copy(rf_image *__return_storage_ptr__,rf_image image,rf_allocator allocator)

{
  rf_source_location rVar1;
  rf_source_location source_location;
  undefined1 auVar2 [24];
  int iVar3;
  void *dst;
  rf_allocator_proc *prVar4;
  uint uVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  uint uStack_8c;
  rf_allocator allocator_local;
  
  prVar4 = allocator.allocator_proc;
  allocator_local.user_data = allocator.user_data;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  allocator_local.allocator_proc = prVar4;
  if (image.valid == true) {
    iVar3 = rf_bytes_per_pixel(image.format);
    uVar5 = iVar3 * image.height * image.width;
    rVar1.proc_name._0_4_ = 0x172ec0;
    rVar1.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar1.proc_name._4_4_ = 0;
    rVar1.line_in_file = 0x3d71;
    auVar2._8_8_ = (ulong)uStack_8c << 0x20;
    auVar2._0_8_ = (long)(int)uVar5;
    auVar2._16_8_ = 0;
    dst = (*prVar4)(&allocator_local,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar2 << 0x40));
    if (dst == (void *)0x0) {
      source_location.proc_name._0_4_ = 0x172ec0;
      source_location.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location.proc_name._4_4_ = 0;
      source_location.line_in_file = 0x3d77;
      rf_log_impl(source_location,RF_LOG_TYPE_ERROR,"Failed to allocate %d bytes",2,(ulong)uVar5,
                  in_R8,in_R9);
      *(char **)(in_FS_OFFSET + -0x450) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(in_FS_OFFSET + -0x448) = "rf_image_copy";
      *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3d77;
      *(undefined4 *)(in_FS_OFFSET + -0x438) = 2;
    }
    else {
      rf_image_copy_to_buffer(__return_storage_ptr__,image,dst,(long)(int)uVar5);
    }
  }
  else {
    rf_log_impl(8,0x172ead,(char *)0x1);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_image_copy";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3d79;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_copy(rf_image image, rf_allocator allocator)
{
    rf_image result = {0};

    if (image.valid)
    {
        int size  = image.width * image.height * rf_bytes_per_pixel(image.format);
        void* dst = RF_ALLOC(allocator, size);

        if (dst)
        {
            result = rf_image_copy_to_buffer(image, dst, size);
        }
        else RF_LOG_ERROR(RF_BAD_ALLOC, "Failed to allocate %d bytes", size);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image was invalid.");

    return result;
}